

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

timediff_t Curl_timeleft(Curl_easy *data,curltime *nowp,_Bool duringconnect)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  timediff_t tVar6;
  timediff_t tVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  curltime cVar11;
  curltime newer;
  curltime older;
  curltime older_00;
  int local_40 [2];
  time_t local_38;
  
  if ((data->set).timeout == 0 && !duringconnect) {
    tVar6 = 0;
  }
  else {
    if (nowp == (curltime *)0x0) {
      cVar11 = Curl_now();
      nowp = (curltime *)&local_38;
      local_38 = cVar11.tv_sec;
      piVar8 = local_40;
      local_40[0] = cVar11.tv_usec;
    }
    else {
      piVar8 = &nowp->tv_usec;
    }
    uVar10 = (ulong)(data->set).timeout;
    if (uVar10 == 0) {
      tVar6 = 0;
    }
    else {
      uVar2 = (data->progress).t_startop.tv_sec;
      uVar3 = (data->progress).t_startop.tv_usec;
      older.tv_usec = uVar3;
      older.tv_sec = uVar2;
      cVar11.tv_usec = *piVar8;
      cVar11.tv_sec = nowp->tv_sec;
      cVar11._12_4_ = 0;
      older._12_4_ = 0;
      tVar6 = Curl_timediff(cVar11,older);
      lVar9 = uVar10 - tVar6;
      tVar6 = -1;
      if (lVar9 != 0) {
        tVar6 = lVar9;
      }
      if (!duringconnect) {
        return tVar6;
      }
    }
    if (duringconnect) {
      uVar1 = (data->set).connecttimeout;
      uVar10 = 300000;
      if (uVar1 != 0) {
        uVar10 = (ulong)uVar1;
      }
      uVar4 = (data->progress).t_startsingle.tv_sec;
      uVar5 = (data->progress).t_startsingle.tv_usec;
      older_00.tv_usec = uVar5;
      older_00.tv_sec = uVar4;
      newer.tv_usec = *piVar8;
      newer.tv_sec = nowp->tv_sec;
      newer._12_4_ = 0;
      older_00._12_4_ = 0;
      tVar7 = Curl_timediff(newer,older_00);
      lVar9 = -1;
      if (uVar10 - tVar7 != 0) {
        lVar9 = uVar10 - tVar7;
      }
      if (tVar6 == 0) {
        return lVar9;
      }
    }
    else {
      lVar9 = 0;
    }
    if (lVar9 < tVar6) {
      tVar6 = lVar9;
    }
  }
  return tVar6;
}

Assistant:

timediff_t Curl_timeleft(struct Curl_easy *data,
                         struct curltime *nowp,
                         bool duringconnect)
{
  timediff_t timeleft_ms = 0;
  timediff_t ctimeleft_ms = 0;
  struct curltime now;

  /* The duration of a connect and the total transfer are calculated from two
     different time-stamps. It can end up with the total timeout being reached
     before the connect timeout expires and we must acknowledge whichever
     timeout that is reached first. The total timeout is set per entire
     operation, while the connect timeout is set per connect. */
  if(data->set.timeout <= 0 && !duringconnect)
    return 0; /* no timeout in place or checked, return "no limit" */

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }

  if(data->set.timeout > 0) {
    timeleft_ms = data->set.timeout -
                  Curl_timediff(*nowp, data->progress.t_startop);
    if(!timeleft_ms)
      timeleft_ms = -1; /* 0 is "no limit", fake 1 ms expiry */
    if(!duringconnect)
      return timeleft_ms; /* no connect check, this is it */
  }

  if(duringconnect) {
    timediff_t ctimeout_ms = (data->set.connecttimeout > 0) ?
      data->set.connecttimeout : DEFAULT_CONNECT_TIMEOUT;
    ctimeleft_ms = ctimeout_ms -
                   Curl_timediff(*nowp, data->progress.t_startsingle);
    if(!ctimeleft_ms)
      ctimeleft_ms = -1; /* 0 is "no limit", fake 1 ms expiry */
    if(!timeleft_ms)
      return ctimeleft_ms; /* no general timeout, this is it */
  }
  /* return minimal time left or max amount already expired */
  return (ctimeleft_ms < timeleft_ms) ? ctimeleft_ms : timeleft_ms;
}